

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_tessellation_state
          (Impl *this,Value *tess,VkPipelineTessellationStateCreateInfo **out_info)

{
  bool bVar1;
  uint uVar2;
  VkPipelineTessellationStateCreateInfo *pVVar3;
  Type pGVar4;
  VkPipelineTessellationStateCreateInfo *state;
  VkPipelineTessellationStateCreateInfo **out_info_local;
  Value *tess_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkPipelineTessellationStateCreateInfo>
                     (&this->allocator);
  pVVar3->sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)tess,"flags");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->flags = uVar2;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)tess,"patchControlPoints");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->patchControlPoints = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(tess,"pNext");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)tess,"pNext");
    bVar1 = parse_pnext_chain(this,pGVar4,&pVVar3->pNext,(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar1) {
      return false;
    }
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_tessellation_state(const Value &tess, const VkPipelineTessellationStateCreateInfo **out_info)
{
	auto *state = allocator.allocate_cleared<VkPipelineTessellationStateCreateInfo>();
	state->sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
	state->flags = tess["flags"].GetUint();
	state->patchControlPoints = tess["patchControlPoints"].GetUint();

	if (tess.HasMember("pNext"))
		if (!parse_pnext_chain(tess["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}